

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3BtreeIntegrityCheck(Btree *p,int *aRoot,int nRoot,int mxErr,int *pnErr)

{
  BtShared *pBt_00;
  u32 uVar1;
  u32 N;
  int iVar2;
  Pgno PVar3;
  char *pcVar4;
  i64 local_118;
  i64 notUsed;
  int mxInHdr;
  int mx;
  char zErr [100];
  u64 savedDbFlags;
  BtShared *pBt;
  IntegrityCk sCheck;
  Pgno i;
  int *pnErr_local;
  int mxErr_local;
  int nRoot_local;
  int *aRoot_local;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  unique0x00012000 = pBt_00->db->flags;
  sqlite3BtreeEnter(p);
  sCheck.pBt = (BtShared *)pBt_00->pPager;
  pBt = pBt_00;
  sCheck.aPgRef._0_4_ = btreePagecount(pBt_00);
  sCheck.nPage = 0;
  sCheck.mxErr = 0;
  sCheck.nErr = 0;
  sCheck.mallocFailed = 0;
  sCheck.zPfx._0_4_ = 0;
  sCheck.zPfx._4_4_ = 0;
  sCheck.pPager = (Pager *)0x0;
  sCheck.errMsg.nChar = 0;
  sCheck.errMsg.accError = '\0';
  sCheck.errMsg.printfFlags = '\0';
  sCheck.errMsg._30_2_ = 0;
  sCheck.aPgRef._4_4_ = mxErr;
  sqlite3StrAccumInit((StrAccum *)&sCheck.v1,(sqlite3 *)0x0,(char *)&mxInHdr,100,1000000000);
  sCheck.errMsg.mxAlloc._1_1_ = 1;
  if ((Pgno)sCheck.aPgRef != 0) {
    sCheck.pPager = (Pager *)sqlite3MallocZero((ulong)(((Pgno)sCheck.aPgRef >> 3) + 1));
    if (sCheck.pPager == (Pager *)0x0) {
      sCheck.mxErr = 1;
    }
    else {
      sCheck.errMsg._24_8_ = sqlite3PageMalloc(pBt_00->pageSize);
      if ((void *)sCheck.errMsg._24_8_ == (void *)0x0) {
        sCheck.mxErr = 1;
      }
      else {
        sCheck.heap._4_4_ = (uint)sqlite3PendingByte / pBt_00->pageSize + 1;
        if (sCheck.heap._4_4_ <= (Pgno)sCheck.aPgRef) {
          setPageReferenced((IntegrityCk *)&pBt,sCheck.heap._4_4_);
        }
        sCheck._32_8_ = anon_var_dwarf_4f660;
        uVar1 = sqlite3Get4byte(pBt_00->pPage1->aData + 0x20);
        N = sqlite3Get4byte(pBt_00->pPage1->aData + 0x24);
        checkList((IntegrityCk *)&pBt,1,uVar1,N);
        sCheck.nErr = 0;
        sCheck.mallocFailed = 0;
        if (pBt_00->autoVacuum == '\0') {
          uVar1 = sqlite3Get4byte(pBt_00->pPage1->aData + 0x40);
          if (uVar1 != 0) {
            checkAppendMsg((IntegrityCk *)&pBt,
                           "incremental_vacuum enabled with a max rootpage of zero");
          }
        }
        else {
          notUsed._4_4_ = 0;
          for (sCheck.heap._4_4_ = 0; (int)sCheck.heap._4_4_ < nRoot;
              sCheck.heap._4_4_ = sCheck.heap._4_4_ + 1) {
            if ((int)notUsed._4_4_ < aRoot[sCheck.heap._4_4_]) {
              notUsed._4_4_ = aRoot[sCheck.heap._4_4_];
            }
          }
          notUsed._0_4_ = sqlite3Get4byte(pBt_00->pPage1->aData + 0x34);
          if (notUsed._4_4_ != (u32)notUsed) {
            checkAppendMsg((IntegrityCk *)&pBt,"max rootpage (%d) disagrees with header (%d)",
                           (ulong)notUsed._4_4_,(ulong)(u32)notUsed);
          }
        }
        pBt_00->db->flags = pBt_00->db->flags & 0xffffffffffdfffff;
        for (sCheck.heap._4_4_ = 0; (int)sCheck.heap._4_4_ < nRoot && sCheck.aPgRef._4_4_ != 0;
            sCheck.heap._4_4_ = sCheck.heap._4_4_ + 1) {
          if (aRoot[sCheck.heap._4_4_] != 0) {
            if ((pBt_00->autoVacuum != '\0') && (1 < aRoot[sCheck.heap._4_4_])) {
              checkPtrmap((IntegrityCk *)&pBt,aRoot[sCheck.heap._4_4_],'\x01',0);
            }
            checkTreePage((IntegrityCk *)&pBt,aRoot[sCheck.heap._4_4_],&local_118,0x7fffffffffffffff
                         );
          }
        }
        pBt_00->db->flags = stack0xffffffffffffff60;
        for (sCheck.heap._4_4_ = 1;
            sCheck.heap._4_4_ <= (Pgno)sCheck.aPgRef && sCheck.aPgRef._4_4_ != 0;
            sCheck.heap._4_4_ = sCheck.heap._4_4_ + 1) {
          iVar2 = getPageReferenced((IntegrityCk *)&pBt,sCheck.heap._4_4_);
          if ((iVar2 == 0) &&
             ((PVar3 = ptrmapPageno(pBt_00,sCheck.heap._4_4_), PVar3 != sCheck.heap._4_4_ ||
              (pBt_00->autoVacuum == '\0')))) {
            checkAppendMsg((IntegrityCk *)&pBt,"Page %d is never used",(ulong)sCheck.heap._4_4_);
          }
          iVar2 = getPageReferenced((IntegrityCk *)&pBt,sCheck.heap._4_4_);
          if (((iVar2 != 0) &&
              (PVar3 = ptrmapPageno(pBt_00,sCheck.heap._4_4_), PVar3 == sCheck.heap._4_4_)) &&
             (pBt_00->autoVacuum != '\0')) {
            checkAppendMsg((IntegrityCk *)&pBt,"Pointer map page %d is referenced",
                           (ulong)sCheck.heap._4_4_);
          }
        }
      }
    }
  }
  sqlite3PageFree((void *)sCheck.errMsg._24_8_);
  sqlite3_free(sCheck.pPager);
  if (sCheck.mxErr != 0) {
    sqlite3_str_reset((StrAccum *)&sCheck.v1);
    sCheck.nPage = sCheck.nPage + 1;
  }
  *pnErr = sCheck.nPage;
  if (sCheck.nPage == 0) {
    sqlite3_str_reset((StrAccum *)&sCheck.v1);
  }
  sqlite3BtreeLeave(p);
  pcVar4 = sqlite3StrAccumFinish((StrAccum *)&sCheck.v1);
  return pcVar4;
}

Assistant:

SQLITE_PRIVATE char *sqlite3BtreeIntegrityCheck(
  Btree *p,     /* The btree to be checked */
  int *aRoot,   /* An array of root pages numbers for individual trees */
  int nRoot,    /* Number of entries in aRoot[] */
  int mxErr,    /* Stop reporting errors after this many */
  int *pnErr    /* Write number of errors seen to this variable */
){
  Pgno i;
  IntegrityCk sCheck;
  BtShared *pBt = p->pBt;
  u64 savedDbFlags = pBt->db->flags;
  char zErr[100];
  VVA_ONLY( int nRef );

  sqlite3BtreeEnter(p);
  assert( p->inTrans>TRANS_NONE && pBt->inTransaction>TRANS_NONE );
  VVA_ONLY( nRef = sqlite3PagerRefcount(pBt->pPager) );
  assert( nRef>=0 );
  sCheck.pBt = pBt;
  sCheck.pPager = pBt->pPager;
  sCheck.nPage = btreePagecount(sCheck.pBt);
  sCheck.mxErr = mxErr;
  sCheck.nErr = 0;
  sCheck.mallocFailed = 0;
  sCheck.zPfx = 0;
  sCheck.v1 = 0;
  sCheck.v2 = 0;
  sCheck.aPgRef = 0;
  sCheck.heap = 0;
  sqlite3StrAccumInit(&sCheck.errMsg, 0, zErr, sizeof(zErr), SQLITE_MAX_LENGTH);
  sCheck.errMsg.printfFlags = SQLITE_PRINTF_INTERNAL;
  if( sCheck.nPage==0 ){
    goto integrity_ck_cleanup;
  }

  sCheck.aPgRef = sqlite3MallocZero((sCheck.nPage / 8)+ 1);
  if( !sCheck.aPgRef ){
    sCheck.mallocFailed = 1;
    goto integrity_ck_cleanup;
  }
  sCheck.heap = (u32*)sqlite3PageMalloc( pBt->pageSize );
  if( sCheck.heap==0 ){
    sCheck.mallocFailed = 1;
    goto integrity_ck_cleanup;
  }

  i = PENDING_BYTE_PAGE(pBt);
  if( i<=sCheck.nPage ) setPageReferenced(&sCheck, i);

  /* Check the integrity of the freelist
  */
  sCheck.zPfx = "Main freelist: ";
  checkList(&sCheck, 1, get4byte(&pBt->pPage1->aData[32]),
            get4byte(&pBt->pPage1->aData[36]));
  sCheck.zPfx = 0;

  /* Check all the tables.
  */
#ifndef SQLITE_OMIT_AUTOVACUUM
  if( pBt->autoVacuum ){
    int mx = 0;
    int mxInHdr;
    for(i=0; (int)i<nRoot; i++) if( mx<aRoot[i] ) mx = aRoot[i];
    mxInHdr = get4byte(&pBt->pPage1->aData[52]);
    if( mx!=mxInHdr ){
      checkAppendMsg(&sCheck,
        "max rootpage (%d) disagrees with header (%d)",
        mx, mxInHdr
      );
    }
  }else if( get4byte(&pBt->pPage1->aData[64])!=0 ){
    checkAppendMsg(&sCheck,
      "incremental_vacuum enabled with a max rootpage of zero"
    );
  }
#endif
  testcase( pBt->db->flags & SQLITE_CellSizeCk );
  pBt->db->flags &= ~(u64)SQLITE_CellSizeCk;
  for(i=0; (int)i<nRoot && sCheck.mxErr; i++){
    i64 notUsed;
    if( aRoot[i]==0 ) continue;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && aRoot[i]>1 ){
      checkPtrmap(&sCheck, aRoot[i], PTRMAP_ROOTPAGE, 0);
    }
#endif
    checkTreePage(&sCheck, aRoot[i], &notUsed, LARGEST_INT64);
  }
  pBt->db->flags = savedDbFlags;

  /* Make sure every page in the file is referenced
  */
  for(i=1; i<=sCheck.nPage && sCheck.mxErr; i++){
#ifdef SQLITE_OMIT_AUTOVACUUM
    if( getPageReferenced(&sCheck, i)==0 ){
      checkAppendMsg(&sCheck, "Page %d is never used", i);
    }
#else
    /* If the database supports auto-vacuum, make sure no tables contain
    ** references to pointer-map pages.
    */
    if( getPageReferenced(&sCheck, i)==0 && 
       (PTRMAP_PAGENO(pBt, i)!=i || !pBt->autoVacuum) ){
      checkAppendMsg(&sCheck, "Page %d is never used", i);
    }
    if( getPageReferenced(&sCheck, i)!=0 && 
       (PTRMAP_PAGENO(pBt, i)==i && pBt->autoVacuum) ){
      checkAppendMsg(&sCheck, "Pointer map page %d is referenced", i);
    }
#endif
  }

  /* Clean  up and report errors.
  */
integrity_ck_cleanup:
  sqlite3PageFree(sCheck.heap);
  sqlite3_free(sCheck.aPgRef);
  if( sCheck.mallocFailed ){
    sqlite3_str_reset(&sCheck.errMsg);
    sCheck.nErr++;
  }
  *pnErr = sCheck.nErr;
  if( sCheck.nErr==0 ) sqlite3_str_reset(&sCheck.errMsg);
  /* Make sure this analysis did not leave any unref() pages. */
  assert( nRef==sqlite3PagerRefcount(pBt->pPager) );
  sqlite3BtreeLeave(p);
  return sqlite3StrAccumFinish(&sCheck.errMsg);
}